

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall
llvm::yaml::Scanner::scanBlockScalarHeader
          (Scanner *this,char *ChompingIndicator,uint *IndentIndicator,bool *IsDone)

{
  char *data;
  char cVar1;
  bool bVar2;
  uint uVar3;
  iterator pcVar4;
  Twine local_b8;
  StringRef local_90;
  undefined1 local_80 [8];
  Token T;
  iterator Start;
  bool *IsDone_local;
  uint *IndentIndicator_local;
  char *ChompingIndicator_local;
  Scanner *this_local;
  
  data = this->Current;
  cVar1 = scanBlockChompingIndicator(this);
  *ChompingIndicator = cVar1;
  uVar3 = scanBlockIndentationIndicator(this);
  *IndentIndicator = uVar3;
  if (*ChompingIndicator == ' ') {
    cVar1 = scanBlockChompingIndicator(this);
    *ChompingIndicator = cVar1;
  }
  T.Value.field_2._8_8_ = skip_s_white;
  pcVar4 = skip_while(this,(SkipWhileFunc)skip_s_white,(iterator)0x0);
  this->Current = pcVar4;
  skipComment(this);
  if (this->Current == this->End) {
    Token::Token((Token *)local_80);
    local_80._0_4_ = TK_BlockScalar;
    StringRef::StringRef(&local_90,data,(long)this->Current - (long)data);
    T._0_8_ = local_90.Data;
    T.Range.Data = (char *)local_90.Length;
    AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
    ::push_back(&this->TokenQueue,(Token *)local_80);
    *IsDone = true;
    this_local._7_1_ = true;
    Token::~Token((Token *)local_80);
  }
  else {
    bVar2 = consumeLineBreakIfPresent(this);
    if (bVar2) {
      this_local._7_1_ = true;
    }
    else {
      Twine::Twine(&local_b8,"Expected a line break after block scalar header");
      setError(this,&local_b8,this->Current);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Scanner::scanBlockScalarHeader(char &ChompingIndicator,
                                    unsigned &IndentIndicator, bool &IsDone) {
  auto Start = Current;

  ChompingIndicator = scanBlockChompingIndicator();
  IndentIndicator = scanBlockIndentationIndicator();
  // Check for the chomping indicator once again.
  if (ChompingIndicator == ' ')
    ChompingIndicator = scanBlockChompingIndicator();
  Current = skip_while(&Scanner::skip_s_white, Current);
  skipComment();

  if (Current == End) { // EOF, we have an empty scalar.
    Token T;
    T.Kind = Token::TK_BlockScalar;
    T.Range = StringRef(Start, Current - Start);
    TokenQueue.push_back(T);
    IsDone = true;
    return true;
  }

  if (!consumeLineBreakIfPresent()) {
    setError("Expected a line break after block scalar header", Current);
    return false;
  }
  return true;
}